

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O3

void __thiscall QTextHtmlExporter::emitAlignment(QTextHtmlExporter *this,Alignment align)

{
  QLatin1String QVar1;
  QLatin1String QVar2;
  QLatin1String QVar3;
  
  if (((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) {
    if (((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) != 0) {
      QVar1.m_data = (char *)0xe;
      QVar1.m_size = (qsizetype)this;
      QString::append(QVar1);
      return;
    }
    if (((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 4) != 0) {
      QVar2.m_data = (char *)0xf;
      QVar2.m_size = (qsizetype)this;
      QString::append(QVar2);
      return;
    }
    if (((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 8) != 0) {
      QVar3.m_data = &DAT_00000010;
      QVar3.m_size = (qsizetype)this;
      QString::append(QVar3);
      return;
    }
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitAlignment(Qt::Alignment align)
{
    if (align & Qt::AlignLeft)
        return;
    else if (align & Qt::AlignRight)
        html += " align=\"right\""_L1;
    else if (align & Qt::AlignHCenter)
        html += " align=\"center\""_L1;
    else if (align & Qt::AlignJustify)
        html += " align=\"justify\""_L1;
}